

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  ulong uVar1;
  WhereLevel *pWVar2;
  u8 uVar3;
  Parse *pParse;
  SrcList *pSVar4;
  sqlite3 *db;
  Vdbe *v;
  WhereLoop *pWVar5;
  Index *pIVar6;
  Table *pTab;
  byte bVar7;
  ushort uVar8;
  int iVar9;
  anon_union_16_2_dad992c1_for_u *paVar10;
  VdbeOp *pVVar11;
  Index *pIVar12;
  WhereLevel *pWVar13;
  int iVar14;
  u8 *puVar15;
  int *piVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  
  pParse = pWInfo->pParse;
  pSVar4 = pWInfo->pTabList;
  db = pParse->db;
  v = pParse->pVdbe;
  pWVar13 = pWInfo->a;
  uVar19 = (ulong)pWInfo->nLevel;
  while (0 < (long)uVar19) {
    uVar1 = uVar19 - 1;
    pWVar2 = pWVar13 + uVar1;
    pWVar5 = pWInfo->a[uVar19 - 1].pWLoop;
    if (pWInfo->a[uVar19 - 1].op == 0xaa) {
      sqlite3VdbeResolveLabel(v,pWVar2->addrCont);
    }
    else {
      iVar9 = 0;
      iVar14 = 0;
      if (((pWInfo->eDistinct == '\x02') && (uVar19 == pWInfo->nLevel)) &&
         (((pWVar5->wsFlags & 0x200) != 0 &&
          (pIVar6 = (pWVar5->u).btree.pIndex, iVar9 = iVar14, (pIVar6->field_0x63 & 0x80) != 0)))) {
        uVar8 = (pWVar5->u).btree.nIdxCol;
        if ((uVar8 != 0) && (uVar18 = (uint)uVar8, 0x23 < pIVar6->aiRowLogEst[uVar8])) {
          iVar9 = pParse->nMem + 1;
          for (uVar17 = 0; uVar18 != uVar17; uVar17 = uVar17 + 1) {
            sqlite3VdbeAddOp3(v,0x5a,pWVar2->iIdxCur,uVar17,uVar17 + iVar9);
          }
          pParse->nMem = pParse->nMem + uVar18 + 1;
          iVar9 = sqlite3VdbeAddOp4Int
                            (v,(uint)(pWVar2->op != '\x04') * 3 + 0x16,pWVar2->iIdxCur,0,iVar9,
                             uVar18);
          sqlite3VdbeAddOp2(v,0xb,1,pWVar2->p2);
        }
      }
      sqlite3VdbeResolveLabel(v,pWVar2->addrCont);
      sqlite3VdbeAddOp3(v,(uint)pWVar2->op,pWVar2->p1,pWVar2->p2,(uint)pWVar2->p3);
      if (0 < (long)v->nOp) {
        v->aOp[(long)v->nOp + -1].p5 = (ushort)pWVar2->p5;
      }
      if (iVar9 != 0) {
        sqlite3VdbeJumpHere(v,iVar9);
      }
    }
    if (((pWVar5->wsFlags & 0x800) != 0) && (0 < (pWVar2->u).in.nIn)) {
      sqlite3VdbeResolveLabel(v,pWVar2->addrNxt);
      uVar19 = (ulong)(pWVar2->u).in.nIn;
      puVar15 = &(pWVar2->u).in.aInLoop[uVar19 - 1].eEndLoopOp;
      for (; 0 < (int)uVar19; uVar19 = (ulong)((int)uVar19 - 1)) {
        sqlite3VdbeJumpHere(v,*(int *)(puVar15 + -0xc) + 1);
        bVar7 = *puVar15;
        if (bVar7 != 0xaa) {
          if (*(int *)(puVar15 + -4) != 0) {
            sqlite3VdbeAddOp4Int
                      (v,0x1a,pWVar2->iIdxCur,v->nOp + 2,*(int *)(puVar15 + -8),
                       *(int *)(puVar15 + -4));
            bVar7 = *puVar15;
          }
          sqlite3VdbeAddOp2(v,(uint)bVar7,((InLoop *)(puVar15 + -0x10))->iCur,
                            *(int *)(puVar15 + -0xc));
        }
        sqlite3VdbeJumpHere(v,*(int *)(puVar15 + -0xc) + -1);
        puVar15 = puVar15 + -0x14;
      }
    }
    sqlite3VdbeResolveLabel(v,pWVar2->addrBrk);
    if (pWVar2->addrSkip != 0) {
      sqlite3VdbeGoto(v,pWVar2->addrSkip);
      sqlite3VdbeJumpHere(v,pWVar2->addrSkip);
      sqlite3VdbeJumpHere(v,pWVar2->addrSkip + -2);
    }
    if (pWVar2->addrLikeRep != 0) {
      sqlite3VdbeAddOp2(v,0x31,pWVar2->iLikeRepCntr >> 1,pWVar2->addrLikeRep);
    }
    uVar19 = uVar1;
    if (pWVar2->iLeftJoin != 0) {
      uVar18 = pWVar5->wsFlags;
      iVar9 = sqlite3VdbeAddOp1(v,0x2f,pWVar2->iLeftJoin);
      if ((uVar18 & 0x40) == 0) {
        sqlite3VdbeAddOp1(v,0x81,pWVar2->iTabCur);
      }
      if (((uVar18 >> 9 & 1) != 0) ||
         (((uVar18 >> 0xd & 1) != 0 && ((pWVar2->u).pCovidx != (Index *)0x0)))) {
        sqlite3VdbeAddOp1(v,0x81,pWVar2->iIdxCur);
      }
      if (pWVar2->op == 'B') {
        sqlite3VdbeAddOp2(v,0xc,pWVar2->p1,pWVar2->addrFirst);
      }
      else {
        sqlite3VdbeGoto(v,pWVar2->addrFirst);
      }
      sqlite3VdbeJumpHere(v,iVar9);
    }
  }
  sqlite3VdbeResolveLabel(v,pWInfo->iBreak);
  uVar18 = 0;
  do {
    if (pWInfo->nLevel <= uVar18) {
      pParse->nQueryLoop = pWInfo->savedNQueryLoop;
      whereInfoFree(db,pWInfo);
      return;
    }
    bVar7 = pWVar13->iFrom;
    if ((pSVar4->a[bVar7].fg.field_0x1 & 0x10) == 0) {
      pTab = pSVar4->a[bVar7].pTab;
      uVar17 = pWVar13->pWLoop->wsFlags;
      if ((uVar17 & 0x240) == 0) {
        if ((uVar17 >> 0xd & 1) == 0) goto LAB_00172000;
        paVar10 = &pWVar13->u;
      }
      else {
        paVar10 = (anon_union_16_2_dad992c1_for_u *)&(pWVar13->pWLoop->u).btree.pIndex;
      }
      pIVar6 = paVar10->pCovidx;
      if ((pIVar6 != (Index *)0x0) &&
         (((pWInfo->eOnePass == '\0' || ((pIVar6->pTable->tabFlags & 0x20) != 0)) &&
          (db->mallocFailed == '\0')))) {
        iVar9 = v->nOp;
        iVar14 = pWVar13->addrBody;
        pVVar11 = sqlite3VdbeGetOp(v,iVar14);
        piVar16 = &pVVar11->p2;
        for (; iVar14 < iVar9; iVar14 = iVar14 + 1) {
          if (piVar16[-1] == pWVar13->iTabCur) {
            uVar3 = ((VdbeOp *)(piVar16 + -2))->opcode;
            if (uVar3 == '\x15') {
LAB_001720a7:
              piVar16[-1] = pWVar13->iIdxCur;
            }
            else if (uVar3 == 0x80) {
              piVar16[-1] = pWVar13->iIdxCur;
              ((VdbeOp *)(piVar16 + -2))->opcode = 0x87;
            }
            else if (uVar3 == 'Z') {
              uVar17 = *piVar16;
              if ((pTab->tabFlags & 0x20) != 0) {
                pIVar12 = sqlite3PrimaryKeyIndex(pTab);
                uVar17 = (uint)(ushort)pIVar12->aiColumn[(int)uVar17];
              }
              uVar8 = sqlite3ColumnOfIndex(pIVar6,(i16)uVar17);
              if (-1 < (short)uVar8) {
                *piVar16 = (uint)uVar8;
                goto LAB_001720a7;
              }
            }
          }
          piVar16 = piVar16 + 6;
        }
      }
    }
    else {
      translateColumnToCopy(pParse,pWVar13->addrBody,pWVar13->iTabCur,pSVar4->a[bVar7].regResult,0);
    }
LAB_00172000:
    uVar18 = uVar18 + 1;
    pWVar13 = pWVar13 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nIdxCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else{
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( pLoop->wsFlags & WHERE_IN_ABLE && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            assert( pLoop->wsFlags & WHERE_IN_EARLYOUT );
            sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                              sqlite3VdbeCurrentAddr(v)+2,
                              pIn->iBase, pIn->nPrefix);
            VdbeCoverage(v);
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        assert( pLevel->iTabCur==pTabList->a[pLevel->iFrom].iCursor );
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED) 
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCovidx) 
      ){
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pTab->zName));
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp;
    Index *pIdx = 0;
    struct SrcList_item *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->regResult, 0);
      continue;
    }

#ifdef SQLITE_ENABLE_EARLY_CURSOR_CLOSE
    /* Close all of the cursors that were opened by sqlite3WhereBegin.
    ** Except, do not close cursors that will be reused by the OR optimization
    ** (WHERE_OR_SUBCLAUSE).  And do not close the OP_OpenWrite cursors
    ** created for the ONEPASS optimization.
    */
    if( (pTab->tabFlags & TF_Ephemeral)==0
     && pTab->pSelect==0
     && (pWInfo->wctrlFlags & WHERE_OR_SUBCLAUSE)==0
    ){
      int ws = pLoop->wsFlags;
      if( pWInfo->eOnePass==ONEPASS_OFF && (ws & WHERE_IDX_ONLY)==0 ){
        sqlite3VdbeAddOp1(v, OP_Close, pTabItem->iCursor);
      }
      if( (ws & WHERE_INDEXED)!=0
       && (ws & (WHERE_IPK|WHERE_AUTO_INDEX))==0 
       && pLevel->iIdxCur!=pWInfo->aiCurOnePass[1]
      ){
        sqlite3VdbeAddOp1(v, OP_Close, pLevel->iIdxCur);
      }
    }
#endif

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    ** 
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCovidx;
    }
    if( pIdx
     && (pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable))
     && !db->mallocFailed
    ){
      last = sqlite3VdbeCurrentAddr(v);
      k = pLevel->addrBody;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE opcodes in range %d..%d\n", k, last-1);
      }
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      for(; k<last; k++, pOp++){
        if( pOp->p1!=pLevel->iTabCur ) continue;
        if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }
          x = sqlite3ColumnOfIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }
          assert( (pLoop->wsFlags & WHERE_IDX_ONLY)==0 || x>=0 
              || pWInfo->eOnePass );
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
      }
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  return;
}